

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAcurv.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChNodeFEAcurv::ChNodeFEAcurv
          (ChNodeFEAcurv *this,ChVector<double> *rxx,ChVector<double> *ryy,ChVector<double> *rzz)

{
  double dVar1;
  undefined1 auVar2 [16];
  long lVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  ChVariablesGenericDiagonalMass *this_00;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  
  ChNodeBase::ChNodeBase((ChNodeBase *)&this->field_0xf8);
  auVar7 = _DAT_00972180;
  (this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase = (_func_int **)0xb30d80;
  *(undefined8 *)&this->field_0xf8 = 0xb30f28;
  *(double *)&(this->super_ChNodeFEAbase).field_0x20 = rxx->m_data[0];
  *(double *)&this->field_0x28 = rxx->m_data[1];
  *(double *)&this->field_0x30 = rxx->m_data[2];
  (this->m_ryy).m_data[0] = ryy->m_data[0];
  (this->m_ryy).m_data[1] = ryy->m_data[1];
  (this->m_ryy).m_data[2] = ryy->m_data[2];
  (this->m_rzz).m_data[0] = rzz->m_data[0];
  (this->m_rzz).m_data[1] = rzz->m_data[1];
  auVar5 = _VNULL;
  auVar8 = ZEXT1664(_VNULL);
  auVar4 = vpermpd_avx2(ZEXT1632(_VNULL),0xd0);
  auVar4 = vblendpd_avx(auVar4,ZEXT832((ulong)rzz->m_data[2]),1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = DAT_00b689a8;
  auVar6 = vbroadcastsd_avx512f(auVar2);
  auVar7 = vpermi2pd_avx512f(auVar7,ZEXT3264(auVar4),auVar6);
  *(undefined1 (*) [64])((this->m_rzz).m_data + 2) = auVar7;
  auVar7 = vpermi2pd_avx512f(_DAT_009721c0,auVar8,auVar6);
  *(undefined1 (*) [64])((this->m_rzz_dt).m_data + 1) = auVar7;
  *(undefined1 (*) [16])(this->m_rzz_dtdt).m_data = auVar5;
  dVar1 = (double)vmovlpd_avx(auVar6._0_16_);
  (this->m_rzz_dtdt).m_data[2] = dVar1;
  this_00 = (ChVariablesGenericDiagonalMass *)::operator_new(0x50);
  ChVariablesGenericDiagonalMass::ChVariablesGenericDiagonalMass(this_00,9);
  *(ChVariablesGenericDiagonalMass **)&(this->super_ChNodeFEAbase).field_0x18 = this_00;
  lVar3 = (this_00->MmassDiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows;
  if (lVar3 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (lVar3 != 0) {
    memset((this_00->MmassDiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data,0,lVar3 << 3);
    return;
  }
  return;
}

Assistant:

ChNodeFEAcurv::ChNodeFEAcurv(const ChVector<>& rxx, const ChVector<>& ryy, const ChVector<>& rzz)
    : m_rxx(rxx),
      m_ryy(ryy),
      m_rzz(rzz),
      m_rxx_dt(VNULL),
      m_ryy_dt(VNULL),
      m_rzz_dt(VNULL),
      m_rxx_dtdt(VNULL),
      m_ryy_dtdt(VNULL),
      m_rzz_dtdt(VNULL) {
    m_variables = new ChVariablesGenericDiagonalMass(9);
    m_variables->GetMassDiagonal().setZero();
}